

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_default_expression.hpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundDefaultExpression::Copy(BoundDefaultExpression *this)

{
  BoundDefaultExpression *this_00;
  long in_RSI;
  LogicalType local_30;
  
  this_00 = (BoundDefaultExpression *)operator_new(0x58);
  LogicalType::LogicalType(&local_30,(LogicalType *)(in_RSI + 0x38));
  BoundDefaultExpression(this_00,&local_30);
  LogicalType::~LogicalType(&local_30);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression = (_func_int **)this_00;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> Copy() const override {
		return make_uniq<BoundDefaultExpression>(return_type);
	}